

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::ElementsDecodeLockingScript::ConvertFromStruct
          (ElementsDecodeLockingScript *this,ElementsDecodeLockingScriptStruct *data)

{
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header,in_RSI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,in_RSI + 0x20);
  *(undefined4 *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(undefined4 *)(in_RSI + 0x40);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             in_RSI + 0x48);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)data);
  std::__cxx11::string::operator=((string *)(in_RDI + 4),in_RSI + 0x80);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             in_RSI + 0xa0);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             in_RSI + 0xc0);
  *(undefined4 *)&in_RDI[6]._M_t._M_impl = *(undefined4 *)(in_RSI + 0xe0);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[6]._M_t._M_impl.super__Rb_tree_header,in_RSI + 0xe8);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)data);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,in_RDI);
  return;
}

Assistant:

void ElementsDecodeLockingScript::ConvertFromStruct(
    const ElementsDecodeLockingScriptStruct& data) {
  asm__ = data.asm_;
  hex_ = data.hex;
  req_sigs_ = data.req_sigs;
  type_ = data.type;
  addresses_.ConvertFromStruct(data.addresses);
  pegout_chain_ = data.pegout_chain;
  pegout_asm_ = data.pegout_asm;
  pegout_hex_ = data.pegout_hex;
  pegout_req_sigs_ = data.pegout_req_sigs;
  pegout_type_ = data.pegout_type;
  pegout_addresses_.ConvertFromStruct(data.pegout_addresses);
  ignore_items = data.ignore_items;
}